

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

uchar ** traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_char>
                   (TrieNode<unsigned_char> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  TrieNode<unsigned_char> *node_00;
  void *pvVar1;
  void *pvVar2;
  size_t __n;
  long lVar3;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket;
  uint i;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    node_00 = (TrieNode<unsigned_char> *)(node->buckets)._M_elems[uVar4];
    if (((node->is_trie).super__Base_bitset<4UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      if (node_00 != (TrieNode<unsigned_char> *)0x0) {
        pvVar1 = (node_00->buckets)._M_elems[0];
        pvVar2 = (node_00->buckets)._M_elems[1];
        __n = (long)pvVar2 - (long)pvVar1;
        if (__n != 0) {
          memmove(dst,pvVar1,__n);
        }
        lVar3 = (long)pvVar2 - (long)pvVar1 >> 3;
        if (uVar4 != 0) {
          mkqsort(dst,(int)lVar3,(int)depth);
        }
        pvVar1 = (node_00->buckets)._M_elems[0];
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1);
        }
        dst = dst + lVar3;
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x100);
  if (node != (TrieNode<unsigned_char> *)0x0) {
    operator_delete(node);
  }
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}